

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

reference __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::operator()
          (View<int,false,std::allocator<unsigned_long>> *this,size_t value,unsigned_long args)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  runtime_error *this_00;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  lVar1 = *(long *)this;
  if ((lVar1 == 0) || (*(long *)(this + 0x28) != 2)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
    sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this,1);
    if (args < sVar3) {
      sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this,1);
      return (reference)(sVar2 * value * 4 + lVar1 + sVar3 * args * 4);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value, 
    const Args... args
) const
{
    testInvariant();
    marray_detail::Assert( MARRAY_NO_DEBUG || ( data_ != 0 && sizeof...(args)+1 == dimension() ) );
    return data_[ strides(0) * static_cast<std::size_t>(value) 
        + static_cast<std::size_t>(elementAccessHelper(sizeof...(args)+1, args...)) ];
}